

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall
embree::ISPCTriangleMesh::ISPCTriangleMesh
          (ISPCTriangleMesh *this,RTCDevice device,uint numTriangles,uint numVertices,
          bool hasNormals,bool hasTexcoords,uint numTimeSteps)

{
  RTCGeometry pRVar1;
  void *pvVar2;
  undefined4 in_ECX;
  ISPCType in_EDX;
  undefined8 in_RSI;
  ISPCGeometry *in_RDI;
  byte in_R8B;
  byte in_R9B;
  uint in_stack_00000008;
  size_t i_1;
  size_t i;
  size_t in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  ulong local_40;
  ulong local_38;
  
  ISPCGeometry::ISPCGeometry(in_RDI,TRIANGLE_MESH);
  *(undefined8 *)(in_RDI + 1) = 0;
  in_RDI[1].geometry = (RTCGeometry)0x0;
  in_RDI[1].materialID = 0;
  in_RDI[1].visited = false;
  *(undefined3 *)&in_RDI[1].field_0x15 = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined4 *)&in_RDI[2].geometry = 0;
  *(undefined4 *)((long)&in_RDI[2].geometry + 4) = 0x3f800000;
  in_RDI[2].materialID = in_stack_00000008;
  *(undefined4 *)&in_RDI[2].visited = in_ECX;
  in_RDI[3].type = in_EDX;
  pRVar1 = (RTCGeometry)rtcNewGeometry(in_RSI,0);
  in_RDI->geometry = pRVar1;
  pvVar2 = alignedUSMMalloc((size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,DEFAULT);
  *(void **)(in_RDI + 1) = pvVar2;
  for (local_38 = 0; local_38 < in_stack_00000008; local_38 = local_38 + 1) {
    pvVar2 = alignedUSMMalloc((size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,DEFAULT);
    *(void **)(*(long *)(in_RDI + 1) + local_38 * 8) = pvVar2;
  }
  if ((in_R8B & 1) != 0) {
    pRVar1 = (RTCGeometry)
             alignedUSMMalloc((size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,DEFAULT);
    in_RDI[1].geometry = pRVar1;
    for (local_40 = 0; local_40 < in_stack_00000008; local_40 = local_40 + 1) {
      pvVar2 = alignedUSMMalloc((size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,DEFAULT)
      ;
      *(void **)(in_RDI[1].geometry + local_40 * 8) = pvVar2;
    }
  }
  if ((in_R9B & 1) != 0) {
    in_stack_ffffffffffffff60 =
         alignedUSMMalloc((size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,DEFAULT);
    *(void **)&in_RDI[1].materialID = in_stack_ffffffffffffff60;
  }
  pvVar2 = alignedUSMMalloc((size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,DEFAULT);
  *(void **)(in_RDI + 2) = pvVar2;
  return;
}

Assistant:

ISPCTriangleMesh::ISPCTriangleMesh (RTCDevice device, unsigned int numTriangles, unsigned int numVertices, bool hasNormals, bool hasTexcoords, unsigned int numTimeSteps)
    : geom(TRIANGLE_MESH),
      positions(nullptr), normals(nullptr), texcoords(nullptr), triangles(nullptr), startTime(0.0f), endTime(1.0f),
      numTimeSteps(numTimeSteps), numVertices(numVertices), numTriangles(numTriangles)
  {
    assert(numTimeSteps);

    geom.geometry = rtcNewGeometry (device, RTC_GEOMETRY_TYPE_TRIANGLE);
    
    positions = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*numTimeSteps);
    for (size_t i=0; i<numTimeSteps; i++)
      positions[i] = (Vec3fa*) alignedUSMMalloc(sizeof(Vec3fa)*numVertices);

    if (hasNormals) {
      normals = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*numTimeSteps);
      for (size_t i=0; i<numTimeSteps; i++)
        normals[i] = (Vec3fa*) alignedUSMMalloc(sizeof(Vec3fa)*numVertices);
    }

    if (hasTexcoords)
      texcoords = (Vec2f*) alignedUSMMalloc(sizeof(Vec2f)*numVertices);

    triangles = (ISPCTriangle*) alignedUSMMalloc(sizeof(ISPCTriangle)*numTriangles);
  }